

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O3

void cl_send_cb(uv_udp_send_t *req,int status)

{
  int iVar1;
  
  if (req == (uv_udp_send_t *)0x0) {
    cl_send_cb_cold_3();
  }
  else if (status == 0) {
    if (req->handle == &client || req->handle == &server) {
      cl_send_cb_called = cl_send_cb_called + 1;
      return;
    }
    goto LAB_00179f99;
  }
  cl_send_cb_cold_1();
LAB_00179f99:
  cl_send_cb_cold_2();
  if (req == (uv_udp_send_t *)&client || req == (uv_udp_send_t *)&server) {
    iVar1 = uv_is_closing((uv_handle_t *)req);
    if (iVar1 == 1) {
      close_cb_called = close_cb_called + 1;
      return;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  iVar1 = uv_is_closing((uv_handle_t *)req);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)req,(uv_close_cb)0x0);
  return;
}

Assistant:

static void cl_send_cb(uv_udp_send_t* req, int status) {
  int r;

  ASSERT(req != NULL);
  ASSERT(status == 0);
  CHECK_HANDLE(req->handle);

  r = uv_udp_recv_start(req->handle, cl_alloc_cb, cl_recv_cb);
  ASSERT(r == 0);

  cl_send_cb_called++;
}